

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O2

void test_decimal128_from_string__invalid_inputs(void)

{
  undefined8 uVar1;
  bson_decimal128_t dec;
  undefined1 local_20 [8];
  long local_18;
  
  bson_decimal128_from_string(".",local_20);
  if (local_18 == 0x7c00000000000000) {
    bson_decimal128_from_string(".e",local_20);
    if (local_18 == 0x7c00000000000000) {
      bson_decimal128_from_string("",local_20);
      if (local_18 == 0x7c00000000000000) {
        bson_decimal128_from_string("invalid",local_20);
        if (local_18 == 0x7c00000000000000) {
          bson_decimal128_from_string("in",local_20);
          if (local_18 == 0x7c00000000000000) {
            bson_decimal128_from_string("i",local_20);
            if (local_18 == 0x7c00000000000000) {
              bson_decimal128_from_string("E02",local_20);
              if (local_18 == 0x7c00000000000000) {
                bson_decimal128_from_string("..1",local_20);
                if (local_18 == 0x7c00000000000000) {
                  bson_decimal128_from_string("1abcede",local_20);
                  if (local_18 == 0x7c00000000000000) {
                    bson_decimal128_from_string("1.24abc",local_20);
                    if (local_18 == 0x7c00000000000000) {
                      bson_decimal128_from_string("1.24abcE+02",local_20);
                      if (local_18 == 0x7c00000000000000) {
                        bson_decimal128_from_string("1.24E+02abc2d",local_20);
                        if (local_18 == 0x7c00000000000000) {
                          bson_decimal128_from_string("E+02",local_20);
                          if (local_18 == 0x7c00000000000000) {
                            bson_decimal128_from_string("e+02",local_20);
                            if (local_18 == 0x7c00000000000000) {
                              return;
                            }
                            uVar1 = 0x12e;
                          }
                          else {
                            uVar1 = 300;
                          }
                        }
                        else {
                          uVar1 = 0x12a;
                        }
                      }
                      else {
                        uVar1 = 0x128;
                      }
                    }
                    else {
                      uVar1 = 0x126;
                    }
                  }
                  else {
                    uVar1 = 0x124;
                  }
                }
                else {
                  uVar1 = 0x122;
                }
              }
              else {
                uVar1 = 0x120;
              }
            }
            else {
              uVar1 = 0x11e;
            }
          }
          else {
            uVar1 = 0x11c;
          }
        }
        else {
          uVar1 = 0x11a;
        }
      }
      else {
        uVar1 = 0x118;
      }
    }
    else {
      uVar1 = 0x116;
    }
  }
  else {
    uVar1 = 0x114;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
          ,uVar1,"test_decimal128_from_string__invalid_inputs","IS_NAN (dec)");
  abort();
}

Assistant:

static void
test_decimal128_from_string__invalid_inputs (void)
{
   bson_decimal128_t dec;

   bson_decimal128_from_string (".", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string (".e", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("invalid", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("in", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("i", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("E02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("..1", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1abcede", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24abc", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24abcE+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("1.24E+02abc2d", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("E+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
   bson_decimal128_from_string ("e+02", &dec);
   BSON_ASSERT (IS_NAN (dec));
}